

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineDefinitions
               (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                *subroutineUniforms,GLenum shader,ostringstream *ret)

{
  int iVar1;
  _func_int *p_Var2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  pointer pSVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  pointer pSVar10;
  ulong uVar11;
  ulong uVar12;
  
  cVar3 = (char)ret;
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"uniform float zero;",0x13);
    std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                          _vptr_basic_ostream[-3] + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  pSVar6 = (subroutineUniforms->
           super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    uVar11 = 0;
    do {
      bVar4 = DefOccurence::occurs(&pSVar6[uVar11].defOccurence,shader);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"subroutine vec4 ",0x10)
        ;
        pSVar6 = (subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                            pSVar6[uVar11].functions.typeName._M_dataplus._M_p,
                            pSVar6[uVar11].functions.typeName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(float param);",0xe);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pSVar6 = (subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pSVar10 = *(pointer *)
                   &pSVar6[uVar11].functions.fn.
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
        ;
        if (*(pointer *)
             ((long)&pSVar6[uVar11].functions.fn.
                     super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             + 8) != pSVar10) {
          lVar8 = 0;
          uVar12 = 0;
          do {
            if (-1 < *(int *)((long)&(pSVar10->index).super_LayoutSpecifierBase.val + lVar8)) {
              bVar4 = DefOccurence::occurs
                                ((DefOccurence *)
                                 ((long)&(pSVar10->index).super_LayoutSpecifierBase.occurence +
                                 lVar8),shader);
              if (bVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                           "layout(index = ",0xf);
                iVar1 = *(int *)((long)&(pSVar10->index).super_LayoutSpecifierBase.numSys + lVar8);
                if (iVar1 == 2) {
                  p_Var2 = (ret->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3];
                  *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                           (long)p_Var2) =
                       *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                                  field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
                  lVar7 = 2;
                  pcVar9 = "0x";
LAB_00bc94e1:
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&ret->super_basic_ostream<char,_std::char_traits<char>_>,pcVar9,lVar7);
                }
                else if (iVar1 == 1) {
                  p_Var2 = (ret->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3];
                  *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                           (long)p_Var2) =
                       *(uint *)(&(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                                  field_0x18 + (long)p_Var2) & 0xffffffb5 | 0x40;
                  lVar7 = 1;
                  pcVar9 = "0";
                  goto LAB_00bc94e1;
                }
                poVar5 = (ostream *)
                         std::ostream::operator<<
                                   (ret,*(int *)((long)&(pSVar10->index).super_LayoutSpecifierBase.
                                                        val + lVar8));
                *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
                     *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) &
                     0xffffffb5 | 2;
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"subroutine(",0xb);
            pSVar6 = (subroutineUniforms->
                     super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                pSVar6[uVar11].functions.typeName._M_dataplus._M_p,
                                pSVar6[uVar11].functions.typeName._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") vec4 ",7);
            lVar7 = *(long *)&(subroutineUniforms->
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar11].functions.fn.
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)(lVar7 + 0xe8 + lVar8),
                                *(long *)(lVar7 + 0xf0 + lVar8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"(float param) { return zero + ",0x1e);
            UniformValue::streamValue
                      ((UniformValue *)
                       (*(long *)&(subroutineUniforms->
                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar11].functions.fn.
                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                        + lVar8 + 0x10),ret,0,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"; }",3);
            std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                                  _vptr_basic_ostream[-3] + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            uVar12 = uVar12 + 1;
            pSVar6 = (subroutineUniforms->
                     super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pSVar10 = *(pointer *)
                       &pSVar6[uVar11].functions.fn.
                        super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ;
            lVar8 = lVar8 + 0x108;
          } while (uVar12 < (ulong)(((long)*(pointer *)
                                            ((long)&pSVar6[uVar11].functions.fn.
                                                                                                        
                                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                            + 8) - (long)pSVar10 >> 3) * 0xf83e0f83e0f83e1));
        }
        LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                  (&pSVar6[uVar11].location,ret,shader);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"subroutine uniform ",
                   0x13);
        pSVar6 = (subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                            pSVar6[uVar11].functions.typeName._M_dataplus._M_p,
                            pSVar6[uVar11].functions.typeName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pSVar6 = (subroutineUniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,pSVar6[uVar11].name._M_dataplus._M_p,pSVar6[uVar11].name._M_string_length)
        ;
        SubroutineUniform::streamArrayStr
                  ((subroutineUniforms->
                   super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar11,ret,-1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&ret->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
        std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                              _vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
      pSVar6 = (subroutineUniforms->
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)(((long)(subroutineUniforms->
                                     super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3
                              ) * 0x4fa4fa4fa4fa4fa5));
  }
  return;
}

Assistant:

static void streamSubroutineDefinitions(const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
											std::ostringstream& ret)
	{
		if (subroutineUniforms.size())
		{
			//add a "zero" uniform;
			ret << "uniform float zero;" << std::endl;
		}

		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			if (subroutineUniforms[i].defOccurence.occurs(shader))
			{

				//subroutine vec4 st0(float param);
				ret << "subroutine vec4 " << subroutineUniforms[i].functions.getTypeName() << "(float param);"
					<< std::endl;

				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					//layout(index = X) subroutine(st0) vec4 sf0(float param) { .... };
					subroutineUniforms[i].functions.fn[fn].index.streamDefinition(ret, shader);
					ret << "subroutine(" << subroutineUniforms[i].functions.getTypeName() << ") vec4 "
						<< subroutineUniforms[i].functions.fn[fn].getName() << "(float param) { return zero + ";
					subroutineUniforms[i].functions.fn[fn].getRetVal().streamValue(ret);
					ret << "; }" << std::endl;
				}

				//layout(location = X) subroutine uniform stX uX[...];
				subroutineUniforms[i].location.streamDefinition(ret, shader);
				ret << "subroutine uniform " << subroutineUniforms[i].functions.getTypeName() << " "
					<< subroutineUniforms[i].getName();
				subroutineUniforms[i].streamArrayStr(ret);
				ret << ";" << std::endl;
			}
		}
	}